

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

void __thiscall PDA::Transducer::StoreFst::StoreFst(StoreFst *this,Grammar *grammar)

{
  State::State(&this->m_currentState,L'S');
  State::State(&this->m_mostState,L'S');
  Grammar::Grammar(&this->m_grammar,grammar);
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  stack<PDA::Transducer::StoreFst::State,std::deque<PDA::Transducer::StoreFst::State,std::allocator<PDA::Transducer::StoreFst::State>>>
  ::
  stack<std::deque<PDA::Transducer::StoreFst::State,std::allocator<PDA::Transducer::StoreFst::State>>,void>
            (&this->m_states);
  return;
}

Assistant:

StoreFst(const Grammar &grammar) : m_grammar(grammar)
    { }